

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonogram.cpp
# Opt level: O0

void __thiscall Nonogram::step(Nonogram *this)

{
  Line *pLVar1;
  bool bVar2;
  Known local_3c0;
  Known local_370;
  Known local_320;
  Known local_2d0;
  Line *local_280;
  value_type *line_2;
  undefined1 local_270 [4];
  uint i_2;
  Known local_220;
  Line *local_1d0;
  value_type *line_1;
  undefined1 local_1c0 [4];
  uint i_1;
  Known local_170;
  Known local_120;
  Known local_d0;
  Line *local_70;
  value_type *line;
  undefined1 local_60 [4];
  uint i;
  Known known;
  Nonogram *this_local;
  
  known.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)this;
  std::pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>,_true>
            ((pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>
              *)local_60);
  for (line._4_4_ = this->m_referred_number; line._4_4_ < (uint)(this->m_x + this->m_y);
      line._4_4_ = line._4_4_ + 1) {
    local_70 = std::vector<Line,_std::allocator<Line>_>::operator[]
                         (&this->m_lines,(ulong)line._4_4_);
    if ((local_70->m_direction & VERTICAL) == HORIZONTAL) {
      bVar2 = horizontal_changed(this,local_70->m_index,-2,-1);
      pLVar1 = local_70;
      if (bVar2) {
        get_horizontal(&local_120,this,local_70->m_index);
        Line::calculate_known(&local_d0,pLVar1,&local_120);
        set_horizontal(this,&local_d0,local_70->m_index);
        std::
        pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
        ~pair(&local_d0);
        std::
        pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
        ~pair(&local_120);
      }
    }
    else {
      bVar2 = vertical_changed(this,local_70->m_index,-2,-1);
      pLVar1 = local_70;
      if (bVar2) {
        get_vertical((Known *)local_1c0,this,local_70->m_index);
        Line::calculate_known(&local_170,pLVar1,(Known *)local_1c0);
        set_vertical(this,&local_170,local_70->m_index);
        std::
        pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
        ~pair(&local_170);
        std::
        pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
        ~pair((pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>
               *)local_1c0);
      }
    }
  }
  for (line_1._4_4_ = 0; line_1._4_4_ < this->m_referred_number; line_1._4_4_ = line_1._4_4_ + 1) {
    local_1d0 = std::vector<Line,_std::allocator<Line>_>::operator[]
                          (&this->m_lines,(ulong)line_1._4_4_);
    if ((local_1d0->m_direction & VERTICAL) == HORIZONTAL) {
      bVar2 = horizontal_changed(this,local_1d0->m_index,-2,-1);
      pLVar1 = local_1d0;
      if (bVar2) {
        get_horizontal(&local_220,this,local_1d0->m_index);
        Line::filter(pLVar1,&local_220);
        std::
        pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
        ~pair(&local_220);
      }
    }
    else {
      bVar2 = vertical_changed(this,local_1d0->m_index,-2,-1);
      pLVar1 = local_1d0;
      if (bVar2) {
        get_vertical((Known *)local_270,this,local_1d0->m_index);
        Line::filter(pLVar1,(Known *)local_270);
        std::
        pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
        ~pair((pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>
               *)local_270);
      }
    }
  }
  for (line_2._4_4_ = 0; line_2._4_4_ < this->m_referred_number; line_2._4_4_ = line_2._4_4_ + 1) {
    local_280 = std::vector<Line,_std::allocator<Line>_>::operator[]
                          (&this->m_lines,(ulong)line_2._4_4_);
    if ((local_280->m_direction & VERTICAL) == HORIZONTAL) {
      bVar2 = horizontal_changed(this,local_280->m_index,-2,-1);
      pLVar1 = local_280;
      if (bVar2) {
        get_horizontal(&local_320,this,local_280->m_index);
        Line::merge_options(&local_2d0,pLVar1,&local_320);
        std::
        pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
        operator=((pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>
                   *)local_60,&local_2d0);
        std::
        pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
        ~pair(&local_2d0);
        std::
        pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
        ~pair(&local_320);
        set_horizontal(this,(pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>
                             *)local_60,local_280->m_index);
      }
    }
    else {
      bVar2 = vertical_changed(this,local_280->m_index,-2,-1);
      pLVar1 = local_280;
      if (bVar2) {
        get_vertical(&local_3c0,this,local_280->m_index);
        Line::merge_options(&local_370,pLVar1,&local_3c0);
        std::
        pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
        operator=((pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>
                   *)local_60,&local_370);
        std::
        pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
        ~pair(&local_370);
        std::
        pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
        ~pair(&local_3c0);
        set_vertical(this,(pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>
                           *)local_60,local_280->m_index);
      }
    }
  }
  std::pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
  ~pair((pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_> *
        )local_60);
  return;
}

Assistant:

void Nonogram::step() {
    Known known;

    // Extract known values from lines that are not yet resolved, and set them in the board.
    for (unsigned int i = m_referred_number; i < m_x + m_y; i++) {
        auto &line = m_lines[i];
        if (line.m_direction == HORIZONTAL) {
            if (horizontal_changed(line.m_index)) {
                set_horizontal(line.calculate_known(get_horizontal(line.m_index)), line.m_index);
            }
        } else if (vertical_changed(line.m_index)) {
            set_vertical(line.calculate_known(get_vertical(line.m_index)), line.m_index);
        }
    }

    // Filter the resolved lines options by what is already known of the line.
    for (unsigned int i = 0; i < m_referred_number; i++) {
        auto &line = m_lines[i];
        if (line.m_direction == HORIZONTAL) {
            if (horizontal_changed(line.m_index)) {
                line.filter(get_horizontal(line.m_index));
            }
        } else if (vertical_changed(line.m_index)) {
            line.filter(get_vertical(line.m_index));
        }
    }

    // Extract known values from resolved lines, and set them in the board.
    for (unsigned int i = 0; i < m_referred_number; i++) {
        auto &line = m_lines[i];
        if (line.m_direction == HORIZONTAL) {
            if (horizontal_changed(line.m_index)) {
                known = line.merge_options(get_horizontal(line.m_index));
                set_horizontal(known, line.m_index);
            }
        } else if (vertical_changed(line.m_index)) {
            known = line.merge_options(get_vertical(line.m_index));
            set_vertical(known, line.m_index);
        }
    }
}